

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::DescriptorProto::IsInitialized(DescriptorProto *this)

{
  bool bVar1;
  
  bVar1 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>(&this->field_);
  if (((((bVar1) &&
        (bVar1 = internal::AllAreInitialized<google::protobuf::DescriptorProto>(&this->nested_type_)
        , bVar1)) &&
       (bVar1 = internal::AllAreInitialized<google::protobuf::EnumDescriptorProto>
                          (&this->enum_type_), bVar1)) &&
      ((bVar1 = internal::AllAreInitialized<google::protobuf::DescriptorProto_ExtensionRange>
                          (&this->extension_range_), bVar1 &&
       (bVar1 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>
                          (&this->extension_), bVar1)))) &&
     ((bVar1 = internal::AllAreInitialized<google::protobuf::OneofDescriptorProto>
                         (&this->oneof_decl_), bVar1 &&
      ((bVar1 = _internal_has_options(this), !bVar1 ||
       (bVar1 = MessageOptions::IsInitialized(this->options_), bVar1)))))) {
    return true;
  }
  return false;
}

Assistant:

bool DescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(field_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(nested_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(enum_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(extension_range_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(extension_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(oneof_decl_)) return false;
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}